

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remap_struct.cpp
# Opt level: O1

void duckdb::RemapEntry::PerformRemap
               (string *remap_target,Value *remap_val,case_insensitive_map_t<RemapIndex> *source_map
               ,case_insensitive_map_t<RemapIndex> *target_map,
               case_insensitive_map_t<RemapEntry> *result)

{
  LogicalTypeId LVar1;
  char cVar2;
  char cVar3;
  pointer pcVar4;
  _Head_base<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>_*,_false>
  _Var5;
  vector<duckdb::Value,_true> *this;
  iterator iVar6;
  iterator iVar7;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *p_Var8;
  child_list_t<LogicalType> *this_00;
  const_reference remap_target_00;
  const_reference pvVar9;
  type source_map_00;
  type target_map_00;
  type result_00;
  BinderException *pBVar10;
  size_type __n;
  bool bVar11;
  RemapEntry remap;
  string remap_source;
  Value struct_val;
  undefined1 local_168 [24];
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_150;
  _Head_base<0UL,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>_*,_false>
  local_140 [2];
  string *local_130;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
  local_128;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
  local_120;
  key_type local_118;
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::RemapEntry>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::RemapEntry>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  *local_f8;
  vector<duckdb::Value,_true> *local_f0;
  string local_e8;
  LogicalType local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  Value local_70;
  
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  local_130 = remap_target;
  local_f8 = (_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::RemapEntry>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::RemapEntry>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)result;
  LogicalType::LogicalType(&local_c8,SQLNULL);
  Value::Value(&local_70,&local_c8);
  LogicalType::~LogicalType(&local_c8);
  LVar1 = (remap_val->type_).id_;
  if (LVar1 != STRUCT) {
    if (LVar1 != VARCHAR) {
      pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
      local_168._0_8_ = local_168 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,"Remap keys for remap_struct needs to be a string or struct",""
                );
      BinderException::BinderException(pBVar10,(string *)local_168);
      __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    Value::ToString_abi_cxx11_((string *)local_168,remap_val);
    ::std::__cxx11::string::operator=((string *)&local_118,(string *)local_168);
    if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
      operator_delete((void *)local_168._0_8_);
    }
LAB_00a1dff2:
    iVar6 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&source_map->_M_h,&local_118);
    if (iVar6.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
        ._M_cur == (__node_type *)0x0) {
      pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
      local_168._0_8_ = local_168 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_168,"Source value %s not found","");
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,local_118._M_dataplus._M_p,
                 local_118._M_dataplus._M_p + local_118._M_string_length);
      BinderException::BinderException<std::__cxx11::string>(pBVar10,(string *)local_168,&local_90);
      __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
    }
    iVar7 = ::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&target_map->_M_h,local_130);
    if (iVar7.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
        ._M_cur != (__node_type *)0x0) {
      cVar2 = *(char *)((long)iVar6.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                              ._M_cur + 0x30);
      cVar3 = *(char *)((long)iVar7.
                              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                              ._M_cur + 0x30);
      local_168._0_8_ = (pointer)0xffffffffffffffff;
      local_168._8_4_ = 0xffffffff;
      local_168._12_4_ = 0xffffffff;
      LogicalType::LogicalType((LogicalType *)(local_168 + 0x10));
      local_140[0]._M_head_impl =
           (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>
            *)0x0;
      optional_idx::optional_idx
                ((optional_idx *)&local_e8,
                 *(idx_t *)((long)iVar6.
                                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                                  ._M_cur + 0x28));
      local_168._0_8_ = local_e8._M_dataplus._M_p;
      local_120 = iVar6.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                  ._M_cur;
      if (local_168 + 0x10 !=
          (undefined1 *)
          ((long)iVar7.
                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                 ._M_cur + 0x30)) {
        local_168[0x10] =
             *(char *)((long)iVar7.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                             ._M_cur + 0x30);
        local_168[0x11] =
             *(char *)((long)iVar7.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                             ._M_cur + 0x31);
        shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
                  (&local_150,
                   (shared_ptr<duckdb::ExtraTypeInfo,_true> *)
                   ((long)iVar7.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                          ._M_cur + 0x38));
      }
      local_128 = iVar7.
                  super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                  ._M_cur;
      if ((cVar2 == 'd' || cVar3 == 'd') || (local_70.is_null == false)) {
        if ((cVar2 != 'd') || ((cVar3 != 'd' || (local_70.is_null == true)))) {
          pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_e8,"Structs require nested remaps","");
          BinderException::BinderException(pBVar10,&local_e8);
          __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        p_Var8 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)operator_new(0x38);
        _Var5._M_head_impl = local_140[0]._M_head_impl;
        p_Var8->_M_buckets = (__buckets_ptr)0x0;
        p_Var8->_M_bucket_count = 0;
        (p_Var8->_M_rehash_policy)._M_max_load_factor = 0.0;
        *(undefined4 *)&(p_Var8->_M_rehash_policy).field_0x4 = 0;
        (p_Var8->_M_rehash_policy)._M_next_resize = 0;
        p_Var8->_M_before_begin = (_Hash_node_base *)0x0;
        p_Var8->_M_element_count = 0;
        p_Var8->_M_single_bucket = (__node_base_ptr)0x0;
        p_Var8->_M_buckets = &p_Var8->_M_single_bucket;
        p_Var8->_M_bucket_count = 1;
        (p_Var8->_M_rehash_policy)._M_max_load_factor = 1.0;
        *(undefined1 (*) [16])&(p_Var8->_M_rehash_policy)._M_next_resize = (undefined1  [16])0x0;
        bVar11 = &(local_140[0]._M_head_impl)->_M_h !=
                 (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)0x0;
        local_140[0]._M_head_impl =
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>
              *)p_Var8;
        if (bVar11) {
          ::std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::~_Hashtable(&(_Var5._M_head_impl)->_M_h);
          operator_delete(_Var5._M_head_impl);
        }
        this_00 = StructType::GetChildTypes_abi_cxx11_(&local_70.type_);
        local_f0 = StructValue::GetChildren(&local_70);
        if ((this_00->
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (this_00->
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ).
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          local_120._M_cur =
               (__node_type *)
               ((long)&((local_120._M_cur)->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>
                       ._M_storage._M_storage + 0x40);
          local_128._M_cur =
               (__node_type *)
               ((long)&((local_128._M_cur)->
                       super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>,_true>
                       ).
                       super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>
                       ._M_storage._M_storage + 0x40);
          __n = 0;
          do {
            remap_target_00 =
                 vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_true>
                 ::operator[](this_00,__n);
            pvVar9 = vector<duckdb::Value,_true>::operator[](local_f0,__n);
            source_map_00 =
                 unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>_>,_true>
                 ::operator*((unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>_>,_true>
                              *)local_120._M_cur);
            target_map_00 =
                 unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>_>,_true>
                 ::operator*((unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapIndex>_>_>_>,_true>
                              *)local_128._M_cur);
            result_00 = unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>_>,_true>
                        ::operator*((unique_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>,_std::default_delete<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>_>,_true>
                                     *)local_140);
            PerformRemap(&remap_target_00->first,pvVar9,source_map_00,target_map_00,result_00);
            __n = __n + 1;
          } while (__n < (ulong)(((long)(this_00->
                                        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                        ).
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(this_00->
                                        super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                        ).
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3) *
                                0x6db6db6db6db6db7));
        }
      }
      ::std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,duckdb::RemapEntry>,std::allocator<std::pair<std::__cxx11::string_const,duckdb::RemapEntry>>,std::__detail::_Select1st,duckdb::CaseInsensitiveStringEquality,duckdb::CaseInsensitiveStringHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string_const&,duckdb::RemapEntry>(local_f8,local_130,local_168);
      _Var5._M_head_impl = local_140[0]._M_head_impl;
      if (&(local_140[0]._M_head_impl)->_M_h !=
          (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           *)0x0) {
        ::std::
        _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
        ::~_Hashtable(&(local_140[0]._M_head_impl)->_M_h);
        operator_delete(_Var5._M_head_impl);
      }
      local_140[0]._M_head_impl =
           (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::RemapEntry>_>_>
            *)0x0;
      LogicalType::~LogicalType((LogicalType *)(local_168 + 0x10));
      Value::~Value(&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      return;
    }
    pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
    local_168._0_8_ = local_168 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"Target value %s not found","");
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    pcVar4 = (local_130->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,pcVar4,pcVar4 + local_130->_M_string_length);
    BinderException::BinderException<std::__cxx11::string>(pBVar10,(string *)local_168,&local_b0);
    __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  bVar11 = StructType::IsUnnamed(&remap_val->type_);
  if (!bVar11) {
    pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
    local_168._0_8_ = local_168 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"Remap keys for remap_struct needs to be an unnamed struct","");
    BinderException::BinderException(pBVar10,(string *)local_168);
    __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  this = StructValue::GetChildren(remap_val);
  if ((long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_start != 0x80) {
    pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
    local_168._0_8_ = local_168 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_168,"Remap keys for remap_struct needs to have two children","");
    BinderException::BinderException(pBVar10,(string *)local_168);
    __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pvVar9 = vector<duckdb::Value,_true>::operator[](this,0);
  if ((pvVar9->type_).id_ == VARCHAR) {
    pvVar9 = vector<duckdb::Value,_true>::operator[](this,1);
    if ((pvVar9->type_).id_ == STRUCT) {
      pvVar9 = vector<duckdb::Value,_true>::operator[](this,0);
      Value::ToString_abi_cxx11_((string *)local_168,pvVar9);
      ::std::__cxx11::string::operator=((string *)&local_118,(string *)local_168);
      if ((undefined1 *)local_168._0_8_ != local_168 + 0x10) {
        operator_delete((void *)local_168._0_8_);
      }
      pvVar9 = vector<duckdb::Value,_true>::operator[](this,1);
      Value::operator=(&local_70,pvVar9);
      goto LAB_00a1dff2;
    }
  }
  pBVar10 = (BinderException *)__cxa_allocate_exception(0x10);
  local_168._0_8_ = local_168 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_168,"Remap keys for remap_struct need to be varchar and struct","");
  BinderException::BinderException(pBVar10,(string *)local_168);
  __cxa_throw(pBVar10,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void PerformRemap(const string &remap_target, const Value &remap_val,
	                         case_insensitive_map_t<RemapIndex> &source_map,
	                         case_insensitive_map_t<RemapIndex> &target_map,
	                         case_insensitive_map_t<RemapEntry> &result) {
		string remap_source;
		Value struct_val;
		if (remap_val.type().id() == LogicalTypeId::VARCHAR) {
			remap_source = remap_val.ToString();
		} else if (remap_val.type().id() == LogicalTypeId::STRUCT) {
			if (!StructType::IsUnnamed(remap_val.type())) {
				throw BinderException("Remap keys for remap_struct needs to be an unnamed struct");
			}
			auto &children = StructValue::GetChildren(remap_val);
			if (children.size() != 2) {
				throw BinderException("Remap keys for remap_struct needs to have two children");
			}
			if (children[0].type().id() != LogicalTypeId::VARCHAR || children[1].type().id() != LogicalTypeId::STRUCT) {
				throw BinderException("Remap keys for remap_struct need to be varchar and struct");
			}
			remap_source = children[0].ToString();
			struct_val = children[1];
		} else {
			throw BinderException("Remap keys for remap_struct needs to be a string or struct");
		}

		// find the source index
		auto entry = source_map.find(remap_source);
		if (entry == source_map.end()) {
			throw BinderException("Source value %s not found", remap_source);
		}
		auto target_entry = target_map.find(remap_target);
		if (target_entry == target_map.end()) {
			throw BinderException("Target value %s not found", remap_target);
		}
		bool source_is_struct = entry->second.type.id() == LogicalTypeId::STRUCT;
		bool target_is_struct = target_entry->second.type.id() == LogicalTypeId::STRUCT;
		RemapEntry remap;
		remap.index = entry->second.index;
		remap.target_type = target_entry->second.type;
		if (source_is_struct || target_is_struct || !struct_val.IsNull()) {
			// this is a struct - we actually need all 3 of these to be true (or none of them to be true)
			if (!source_is_struct || !target_is_struct || struct_val.IsNull()) {
				throw BinderException("Structs require nested remaps");
			}
			remap.child_remaps = make_uniq<case_insensitive_map_t<RemapEntry>>();
			auto &remap_types = StructType::GetChildTypes(struct_val.type());
			auto &remap_values = StructValue::GetChildren(struct_val);
			for (idx_t child_idx = 0; child_idx < remap_types.size(); child_idx++) {
				PerformRemap(remap_types[child_idx].first, remap_values[child_idx], *entry->second.child_map,
				             *target_entry->second.child_map, *remap.child_remaps);
			}
		}
		result.emplace(remap_target, std::move(remap));
	}